

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  char *pcVar1;
  unsigned_long *puVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  undefined1 *puVar7;
  undefined1 auStack_35 [5];
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar2 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) ||
     ((puVar2 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar2 != (unsigned_long *)0x0 && ((*puVar2 & 1) == 0)))) {
    ConstantVector::SetNull(result,true);
    return;
  }
  local_28 = *(ulong *)left->data;
  local_20 = *(ulong *)((long)left->data + 8);
  uVar4 = *(ulong *)right->data;
  local_30 = *(ulong *)((long)right->data + 8);
  uVar3 = (uint)uVar4;
  if (uVar3 <= (uint)local_28) {
    uVar4 = uVar4 & 0xffffffff;
    if ((uint)local_28 < 0xd) {
      local_20 = (long)&local_28 + 4;
    }
    puVar7 = auStack_35;
    if (0xc < uVar3) {
      puVar7 = (undefined1 *)(local_30 - 1);
    }
    pcVar5 = (char *)(local_20 + (local_28 & 0xffffffff));
    do {
      pcVar5 = pcVar5 + -1;
      bVar6 = (int)uVar4 < 1;
      if ((int)uVar4 < 1) goto LAB_01503a4a;
      pcVar1 = puVar7 + uVar4;
      uVar4 = uVar4 - 1;
    } while (*pcVar1 == *pcVar5);
  }
  bVar6 = false;
LAB_01503a4a:
  *result->data = bVar6;
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}